

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O2

void __thiscall gl4cts::ShaderSubroutine::Utils::vertexArray::~vertexArray(vertexArray *this)

{
  int iVar1;
  undefined4 extraout_var;
  
  if (this->m_id != 0) {
    iVar1 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x490))(1,this);
    this->m_id = 0;
  }
  return;
}

Assistant:

Utils::vertexArray::~vertexArray()
{
	if (0 != m_id)
	{
		const glw::Functions& gl = m_context.getRenderContext().getFunctions();

		gl.deleteVertexArrays(1, &m_id);

		m_id = 0;
	}
}